

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pvVar1;
  Scalar *pSVar2;
  pointer __x;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  est_data;
  VectorXd x;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  data;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string path;
  _Vector_base<double,_std::allocator<double>_> local_e8;
  KalmanFilterPos kf;
  
  std::__cxx11::string::string((string *)&path,"../imu_data.txt",(allocator *)&kf);
  std::__cxx11::string::string((string *)&local_128,(string *)&path);
  readData(&data,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&est_data,4,(allocator_type *)&kf);
  KalmanFilterPos::KalmanFilterPos(&kf);
  for (__x = data.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __x != data.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_e8,__x);
    KalmanFilterPos::processMeasurement
              ((KalmanFilterPos *)&x,(vector<double,_std::allocator<double>_> *)&kf);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e8);
    pvVar1 = est_data.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x,0);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar1,pSVar2);
    pvVar1 = est_data.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x,1);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar1 + 1,pSVar2);
    pvVar1 = est_data.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x,2);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar1 + 2,pSVar2);
    pvVar1 = est_data.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x,3);
    std::vector<double,_std::allocator<double>_>::push_back(pvVar1 + 3,pSVar2);
    free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  std::__cxx11::string::string((string *)&local_148,"../output/posx.txt",(allocator *)&x);
  writeFile(&local_148,
            est_data.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::string((string *)&local_168,"../output/posy.txt",(allocator *)&x);
  writeFile(&local_168,
            est_data.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string((string *)&local_188,"../output/velx.txt",(allocator *)&x);
  writeFile(&local_188,
            est_data.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 2);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_1a8,"../output/vely.txt",(allocator *)&x);
  writeFile(&local_1a8,
            est_data.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 3);
  std::__cxx11::string::~string((string *)&local_1a8);
  KalmanFilterPos::~KalmanFilterPos(&kf);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&est_data);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&data);
  std::__cxx11::string::~string((string *)&path);
  return 0;
}

Assistant:

int main(){
    string path = "../imu_data.txt";
    vector<vector<double>> data = readData(path);
    vector<vector<double>> est_data(4);
    KalmanFilterPos kf;
    for(auto &d: data){
        VectorXd x = kf.processMeasurement(d);
        est_data[0].push_back(x(0));
        est_data[1].push_back(x(1));
        est_data[2].push_back(x(2));
        est_data[3].push_back(x(3));
    }
    writeFile("../output/posx.txt",est_data[0]);
    writeFile("../output/posy.txt",est_data[1]);
    writeFile("../output/velx.txt",est_data[2]);
    writeFile("../output/vely.txt",est_data[3]);

    return 0;
}